

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryOperatorOverloadTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MemoryLeakOverridesToBeUsedInProductionCode_newDeleteArrayOverloadsWithIntLineWorks_TestShell::
createTest(TEST_MemoryLeakOverridesToBeUsedInProductionCode_newDeleteArrayOverloadsWithIntLineWorks_TestShell
           *this)

{
  TEST_MemoryLeakOverridesToBeUsedInProductionCode_newDeleteArrayOverloadsWithIntLineWorks_Test
  *this_00;
  TEST_MemoryLeakOverridesToBeUsedInProductionCode_newDeleteArrayOverloadsWithIntLineWorks_TestShell
  *this_local;
  
  this_00 = (TEST_MemoryLeakOverridesToBeUsedInProductionCode_newDeleteArrayOverloadsWithIntLineWorks_Test
             *)operator_new(0x10);
  TEST_MemoryLeakOverridesToBeUsedInProductionCode_newDeleteArrayOverloadsWithIntLineWorks_Test::
  TEST_MemoryLeakOverridesToBeUsedInProductionCode_newDeleteArrayOverloadsWithIntLineWorks_Test
            (this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MemoryLeakOverridesToBeUsedInProductionCode, newDeleteArrayOverloadsWithIntLineWorks)
{
    const int line = 42;
    char* leak = new("TestFile.cpp", line) char[10];

    size_t memLeaks = memLeakDetector->totalMemoryLeaks(mem_leak_period_checking);
    STRCMP_NOCASE_CONTAINS("Allocated at: TestFile.cpp and line: 42.", memLeakDetector->report(mem_leak_period_checking));

    ::operator delete [] (leak, "TestFile.cpp", line);

    LONGS_EQUAL(memLeaks-1, memLeakDetector->totalMemoryLeaks(mem_leak_period_checking));
}